

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
               *this,size_t bucket_cnt,hasher *hashfn,key_equal *eq,allocator_type *alloc)

{
  ctrl_t *pcVar1;
  size_t new_capacity_00;
  size_t new_capacity;
  allocator<phmap::priv::(anonymous_namespace)::Entry> *local_30;
  allocator_type *alloc_local;
  key_equal *eq_local;
  hasher *hashfn_local;
  size_t bucket_cnt_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  *this_local;
  
  local_30 = alloc;
  alloc_local = (allocator_type *)eq;
  eq_local = (key_equal *)hashfn;
  hashfn_local = (hasher *)bucket_cnt;
  bucket_cnt_local = (size_t)this;
  pcVar1 = EmptyGroup<std::is_same<std::allocator<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>>
                     ();
  this->ctrl_ = pcVar1;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  new_capacity._4_4_ = 0;
  std::
  tuple<unsigned_long,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::
  tuple<int,_const_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>_&,_const_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>_&,_const_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_&,_true,_true>
            (&this->settings_,(int *)((long)&new_capacity + 4),
             (Hash<phmap::priv::(anonymous_namespace)::Entry> *)eq_local,
             (EqualTo<phmap::priv::(anonymous_namespace)::Entry> *)alloc_local,local_30);
  if (hashfn_local != (hasher *)0x0) {
    new_capacity_00 = NormalizeCapacity((size_t)hashfn_local);
    reset_growth_left(this,new_capacity_00);
    initialize_slots(this,new_capacity_00);
    this->capacity_ = new_capacity_00;
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_cnt, const hasher& hashfn = hasher(),
                          const key_equal& eq = key_equal(),
                          const allocator_type& alloc = allocator_type())
        : ctrl_(EmptyGroup<std_alloc_t>()), settings_(0, hashfn, eq, alloc) {
        if (bucket_cnt) {
            size_t new_capacity = NormalizeCapacity(bucket_cnt);
            reset_growth_left(new_capacity);
            initialize_slots(new_capacity);
            capacity_ = new_capacity;
        }
    }